

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  ostream *poVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ss;
  int iVar2;
  __pid_t _Var3;
  size_t sVar4;
  int *piVar5;
  undefined8 *puVar6;
  long *plVar7;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 extraout_RAX_01;
  long *plVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_00;
  char *pcVar11;
  undefined8 uVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  long lVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  int local_13c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  undefined8 local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  string local_118;
  int local_f8;
  int local_f4;
  int pipe_fd [2];
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  long local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  long local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  long local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  sVar4 = GetThreadCount();
  if (sVar4 != 1) {
    GTestLog::GTestLog((GTestLog *)&local_70,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/lib/googletest/src/gtest-death-test.cc"
                       ,0x344);
    Message::Message((Message *)&local_b0);
    ss.ptr_ = local_b0.ptr_;
    poVar1 = (ostream *)(local_b0.ptr_ + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Death tests use fork(), which is unsafe particularly",0x34);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1," in a threaded context. For this test, ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Google Test",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    if (sVar4 == 0) {
      lVar14 = 0x26;
      pcVar11 = "couldn\'t detect the number of threads.";
    }
    else {
      lVar14 = 9;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"detected ",9);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      pcVar11 = " threads.";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar11,lVar14);
    StringStreamToString(&local_90,ss.ptr_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ss.ptr_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)ss.ptr_ + 8))(ss.ptr_);
      local_b0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,local_90._M_dataplus._M_p,local_90._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    GTestLog::~GTestLog((GTestLog *)&local_70);
  }
  iVar2 = pipe(&local_f8);
  if (iVar2 == -1) {
    paVar15 = &local_128;
    local_138 = paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"CHECK failed: File ","");
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
    paVar16 = &local_c0;
    local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar6;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if (local_d0 == paVar13) {
      local_c0._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_c0._8_8_ = puVar6[3];
      local_d0 = paVar16;
    }
    else {
      local_c0._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_c8 = puVar6[1];
    *puVar6 = paVar13;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
    paVar13 = &local_40;
    local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar6;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar6 + 2);
    if (local_50 == paVar9) {
      local_40._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_40._8_8_ = puVar6[3];
      local_50 = paVar13;
    }
    else {
      local_40._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_48 = puVar6[1];
    *puVar6 = paVar9;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    local_118._M_dataplus._M_p._0_4_ = 0x348;
    StreamableToString<int>((string *)pipe_fd,(int *)&local_118);
    uVar12 = 0xf;
    if (local_50 != paVar13) {
      uVar12 = local_40._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_e8 + local_48) {
      uVar12 = 0xf;
      if (pipe_fd != (int  [2])&local_e0) {
        uVar12 = local_e0._M_allocated_capacity;
      }
      paVar9 = local_50;
      if (local_e8 + local_48 <= (ulong)uVar12) goto LAB_0012e0a2;
    }
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)pipe_fd);
LAB_0012e0b2:
    local_70 = (long *)*puVar6;
    plVar7 = puVar6 + 2;
    if (local_70 == plVar7) {
      local_60 = *plVar7;
      lStack_58 = puVar6[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar7;
    }
    local_68 = puVar6[1];
    *puVar6 = plVar7;
    puVar6[1] = 0;
    *(undefined1 *)plVar7 = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
    paVar9 = &local_a0;
    local_b0.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar6;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.ptr_ == paVar10) {
      local_a0._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_a0._8_8_ = puVar6[3];
      local_b0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar9;
    }
    else {
      local_a0._M_allocated_capacity = paVar10->_M_allocated_capacity;
    }
    local_a8 = puVar6[1];
    *puVar6 = paVar10;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
    local_90._M_dataplus._M_p = (pointer)*puVar6;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == paVar10) {
      local_90.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_90.field_2._8_8_ = puVar6[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    }
    local_90._M_string_length = puVar6[1];
    *puVar6 = paVar10;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    DeathTestAbort(&local_90);
    puVar6 = extraout_RAX_00;
    local_90._M_dataplus._M_p = (pointer)extraout_RDX_00;
  }
  else {
    paVar15 = &local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
    std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar15) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
    fflush((FILE *)0x0);
    _Var3 = fork();
    if (_Var3 != -1) {
      *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x2c = _Var3;
      if (_Var3 == 0) {
        do {
          iVar2 = close(local_f8);
          if (iVar2 != -1) {
            (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = local_f4;
            UnitTest::GetInstance();
            (((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_)->forwarding_enabled_ =
                 false;
            g_in_fast_death_test_child = 1;
            return EXECUTE_TEST;
          }
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
        pipe_fd = (int  [2])&local_e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)pipe_fd,"CHECK failed: File ","");
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)pipe_fd);
        local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar6;
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar6 + 2);
        if (local_138 == paVar16) {
          local_128._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_128._8_8_ = puVar6[3];
          local_138 = &local_128;
        }
        else {
          local_128._M_allocated_capacity = paVar16->_M_allocated_capacity;
        }
        local_130 = puVar6[1];
        *puVar6 = paVar16;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
        local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar6;
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar6 + 2);
        if (local_d0 == paVar16) {
          local_c0._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_c0._8_8_ = puVar6[3];
          local_d0 = &local_c0;
        }
        else {
          local_c0._M_allocated_capacity = paVar16->_M_allocated_capacity;
        }
        local_c8 = puVar6[1];
        *puVar6 = paVar16;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        local_13c = 0x359;
        StreamableToString<int>(&local_118,&local_13c);
        uVar12 = 0xf;
        if (local_d0 != &local_c0) {
          uVar12 = local_c0._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_118._M_string_length + local_c8) {
          uVar12 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_118._M_dataplus._M_p._4_4_,local_118._M_dataplus._M_p._0_4_) !=
              &local_118.field_2) {
            uVar12 = local_118.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar12 < local_118._M_string_length + local_c8) goto LAB_0012db98;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_d0);
        }
        else {
LAB_0012db98:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_d0,
                              CONCAT44(local_118._M_dataplus._M_p._4_4_,
                                       local_118._M_dataplus._M_p._0_4_));
        }
        local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar6;
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar6 + 2);
        if (local_50 == paVar16) {
          local_40._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_40._8_8_ = puVar6[3];
          local_50 = &local_40;
        }
        else {
          local_40._M_allocated_capacity = paVar16->_M_allocated_capacity;
        }
        local_48 = puVar6[1];
        *puVar6 = paVar16;
        puVar6[1] = 0;
        paVar16->_M_local_buf[0] = '\0';
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
        local_70 = (long *)*puVar6;
        plVar7 = puVar6 + 2;
        if (local_70 == plVar7) {
          local_60 = *plVar7;
          lStack_58 = puVar6[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar7;
        }
        local_68 = puVar6[1];
        *puVar6 = plVar7;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
        local_b0.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar6;
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0.ptr_ == paVar16) {
          local_a0._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_a0._8_8_ = puVar6[3];
          local_b0.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0;
        }
        else {
          local_a0._M_allocated_capacity = paVar16->_M_allocated_capacity;
        }
        local_a8 = puVar6[1];
        *puVar6 = paVar16;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
        local_90._M_dataplus._M_p = (pointer)*puVar6;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(puVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar9) goto LAB_0012e071;
        local_90.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_90.field_2._8_8_ = puVar6[3];
        local_90._M_dataplus._M_p = (pointer)paVar15;
      }
      else {
        do {
          iVar2 = close(local_f4);
          if (iVar2 != -1) {
            (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_f8;
            (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
            return OVERSEE_TEST;
          }
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
        pipe_fd = (int  [2])&local_e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)pipe_fd,"CHECK failed: File ","");
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)pipe_fd);
        local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar6;
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar6 + 2);
        if (local_138 == paVar16) {
          local_128._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_128._8_8_ = puVar6[3];
          local_138 = &local_128;
        }
        else {
          local_128._M_allocated_capacity = paVar16->_M_allocated_capacity;
        }
        local_130 = puVar6[1];
        *puVar6 = paVar16;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
        local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar6;
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar6 + 2);
        if (local_d0 == paVar16) {
          local_c0._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_c0._8_8_ = puVar6[3];
          local_d0 = &local_c0;
        }
        else {
          local_c0._M_allocated_capacity = paVar16->_M_allocated_capacity;
        }
        local_c8 = puVar6[1];
        *puVar6 = paVar16;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        local_13c = 0x365;
        StreamableToString<int>(&local_118,&local_13c);
        uVar12 = 0xf;
        if (local_d0 != &local_c0) {
          uVar12 = local_c0._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_118._M_string_length + local_c8) {
          uVar12 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_118._M_dataplus._M_p._4_4_,local_118._M_dataplus._M_p._0_4_) !=
              &local_118.field_2) {
            uVar12 = local_118.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar12 < local_118._M_string_length + local_c8) goto LAB_0012da25;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_d0);
        }
        else {
LAB_0012da25:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_d0,
                              CONCAT44(local_118._M_dataplus._M_p._4_4_,
                                       local_118._M_dataplus._M_p._0_4_));
        }
        local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar6;
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar6 + 2);
        if (local_50 == paVar16) {
          local_40._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_40._8_8_ = puVar6[3];
          local_50 = &local_40;
        }
        else {
          local_40._M_allocated_capacity = paVar16->_M_allocated_capacity;
        }
        local_48 = puVar6[1];
        *puVar6 = paVar16;
        puVar6[1] = 0;
        paVar16->_M_local_buf[0] = '\0';
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_70 = (long *)*plVar7;
        plVar8 = plVar7 + 2;
        if (local_70 == plVar8) {
          local_60 = *plVar8;
          lStack_58 = plVar7[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar8;
        }
        local_68 = plVar7[1];
        *plVar7 = (long)plVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
        local_b0.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar7;
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0.ptr_ == paVar16) {
          local_a0._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_a0._8_8_ = plVar7[3];
          local_b0.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0;
        }
        else {
          local_a0._M_allocated_capacity = paVar16->_M_allocated_capacity;
        }
        local_a8 = plVar7[1];
        *plVar7 = (long)paVar16;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
        local_90._M_dataplus._M_p = (pointer)*puVar6;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(puVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p == paVar9) {
          local_90.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_90.field_2._8_8_ = puVar6[3];
          local_90._M_dataplus._M_p = (pointer)paVar15;
        }
        else {
          local_90.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_90._M_string_length = puVar6[1];
        *puVar6 = paVar9;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        DeathTestAbort(&local_90);
        puVar6 = extraout_RAX;
        local_90._M_dataplus._M_p = (pointer)extraout_RDX;
LAB_0012e071:
        local_90.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      }
      paVar16 = &local_e0;
      paVar13 = &local_128;
      local_90._M_string_length = puVar6[1];
      *puVar6 = paVar9;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      DeathTestAbort(&local_90);
LAB_0012e0a2:
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)pipe_fd,0,(char *)0x0,(ulong)paVar9);
      goto LAB_0012e0b2;
    }
    paVar16 = &local_128;
    local_138 = paVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"CHECK failed: File ","");
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
    paVar13 = &local_c0;
    local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar6;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar6 + 2);
    if (local_d0 == paVar9) {
      local_c0._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_c0._8_8_ = puVar6[3];
      local_d0 = paVar13;
    }
    else {
      local_c0._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_c8 = puVar6[1];
    *puVar6 = paVar9;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
    paVar9 = &local_40;
    local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar6;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if (local_50 == paVar10) {
      local_40._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_40._8_8_ = puVar6[3];
      local_50 = paVar9;
    }
    else {
      local_40._M_allocated_capacity = paVar10->_M_allocated_capacity;
    }
    local_48 = puVar6[1];
    *puVar6 = paVar10;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    local_118._M_dataplus._M_p._0_4_ = 0x356;
    StreamableToString<int>((string *)pipe_fd,(int *)&local_118);
    uVar12 = 0xf;
    if (local_50 != paVar9) {
      uVar12 = local_40._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_e8 + local_48) {
      uVar12 = 0xf;
      if (pipe_fd != (int  [2])&local_e0) {
        uVar12 = local_e0._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_e8 + local_48) goto LAB_0012dfd1;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)pipe_fd,0,(char *)0x0,(ulong)local_50);
    }
    else {
LAB_0012dfd1:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)pipe_fd);
    }
    local_70 = (long *)*puVar6;
    plVar7 = puVar6 + 2;
    if (local_70 == plVar7) {
      local_60 = *plVar7;
      lStack_58 = puVar6[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar7;
    }
    local_68 = puVar6[1];
    *puVar6 = plVar7;
    puVar6[1] = 0;
    *(undefined1 *)plVar7 = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
    local_b0.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar6;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.ptr_ == paVar10) {
      local_a0._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_a0._8_8_ = puVar6[3];
      local_b0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0;
    }
    else {
      local_a0._M_allocated_capacity = paVar10->_M_allocated_capacity;
    }
    local_a8 = puVar6[1];
    *puVar6 = paVar10;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
    local_90._M_dataplus._M_p = (pointer)*puVar6;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == paVar10) {
      local_90.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_90.field_2._8_8_ = puVar6[3];
      local_90._M_dataplus._M_p = (pointer)paVar15;
      goto LAB_0012e2b3;
    }
  }
  local_90.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
LAB_0012e2b3:
  local_90._M_string_length = puVar6[1];
  *puVar6 = paVar10;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  DeathTestAbort(&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar15) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.ptr_ != &local_a0) {
    operator_delete(local_b0.ptr_);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (pipe_fd != (int  [2])&local_e0) {
    operator_delete((void *)pipe_fd);
  }
  if (local_50 != paVar9) {
    operator_delete(local_50);
  }
  if (local_d0 != paVar13) {
    operator_delete(local_d0);
  }
  if (local_138 != paVar16) {
    operator_delete(local_138);
  }
  _Unwind_Resume(extraout_RAX_01);
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding();
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}